

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O3

Aig_Man_t * Gia_ManToAigSimple(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  uint uVar5;
  undefined8 *__s;
  Aig_Man_t *p_00;
  char *pcVar6;
  Aig_Obj_t *pAVar7;
  uint uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  
  iVar1 = p->nObjs;
  sVar11 = (long)iVar1 << 3;
  __s = (undefined8 *)malloc(sVar11);
  memset(__s,0xff,sVar11);
  p_00 = Aig_ManStart(iVar1);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar6,pcVar2);
  }
  p_00->pName = pcVar6;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar6,pcVar2);
  }
  p_00->pSpec = pcVar6;
  p_00->nConstrs = p->nConstrs;
  if (p->nObjs < 1) {
LAB_007001da:
    Aig_ManSetRegNum(p_00,p->nRegs);
    if (__s == (undefined8 *)0x0) {
      return p_00;
    }
  }
  else {
    lVar12 = 8;
    uVar10 = 0;
    puVar9 = __s;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) goto LAB_007001da;
      uVar4 = *(ulong *)((long)pGVar3 + lVar12 + -8);
      uVar8 = (uint)uVar4;
      if ((uVar4 & 0x1fffffff) == 0x1fffffff || (int)uVar8 < 0) {
        if ((~uVar8 & 0x9fffffff) == 0) {
          pAVar7 = Aig_ObjCreateCi(p_00);
        }
        else if ((int)uVar8 < 0 && (int)(uVar4 & 0x1fffffff) != 0x1fffffff) {
          pAVar7 = Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                                        ((ulong)(uVar8 >> 0x1d & 1) ^
                                        *(ulong *)((long)puVar9 - (ulong)(uVar8 * 8))));
        }
        else {
          if ((~uVar4 & 0x1fffffff1fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAig.c"
                          ,0x188,"Aig_Man_t *Gia_ManToAigSimple(Gia_Man_t *)");
          }
          pAVar7 = (Aig_Obj_t *)((ulong)p_00->pConst1 ^ 1);
        }
      }
      else {
        uVar5 = (uint)(uVar4 >> 0x20);
        pAVar7 = Aig_And(p_00,(Aig_Obj_t *)
                              ((ulong)((uint)(uVar4 >> 0x1d) & 1) ^
                              *(ulong *)((long)puVar9 - (ulong)(uVar8 * 8))),
                         (Aig_Obj_t *)
                         ((ulong)(uVar5 >> 0x1d & 1) ^
                         *(ulong *)((long)puVar9 - (ulong)(uVar5 << 3))));
      }
      *puVar9 = pAVar7;
      iVar1 = *(int *)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x24);
      if (iVar1 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      *(uint *)(&pGVar3->field_0x0 + lVar12) = ((uint)pAVar7 & 1) + iVar1 * 2;
      if ((uVar10 != 0) && (uVar10 != (uint)pAVar7->Id)) {
        __assert_fail("i == 0 || Aig_ObjId(ppNodes[i]) == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAig.c"
                      ,0x18a,"Aig_Man_t *Gia_ManToAigSimple(Gia_Man_t *)");
      }
      uVar10 = uVar10 + 1;
      puVar9 = puVar9 + 1;
      lVar12 = lVar12 + 0xc;
    } while ((long)uVar10 < (long)p->nObjs);
    Aig_ManSetRegNum(p_00,p->nRegs);
  }
  free(__s);
  return p_00;
}

Assistant:

Aig_Man_t * Gia_ManToAigSimple( Gia_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t ** ppNodes;
    Gia_Obj_t * pObj;
    int i;
    ppNodes = ABC_FALLOC( Aig_Obj_t *, Gia_ManObjNum(p) );
    // create the new manager
    pNew = Aig_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    // create the PIs
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            ppNodes[i] = Aig_And( pNew, Gia_ObjChild0Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)), Gia_ObjChild1Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)) );
        else if ( Gia_ObjIsCi(pObj) )
            ppNodes[i] = Aig_ObjCreateCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            ppNodes[i] = Aig_ObjCreateCo( pNew, Gia_ObjChild0Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)) );
        else if ( Gia_ObjIsConst0(pObj) )
            ppNodes[i] = Aig_ManConst0(pNew);
        else
            assert( 0 );
        pObj->Value = Abc_Var2Lit( Aig_ObjId(Aig_Regular(ppNodes[i])), Aig_IsComplement(ppNodes[i]) );
        assert( i == 0 || Aig_ObjId(ppNodes[i]) == i );
    }
    Aig_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    ABC_FREE( ppNodes );
    return pNew;
}